

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmListFileBacktrace *this_00;
  cmGeneratorTarget *this_01;
  char *target_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  char *pcVar3;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmCompiledGeneratorExpression *pcVar4;
  cmLocalGenerator *pcVar5;
  ostream *poVar6;
  string *psVar7;
  ulong uVar8;
  mapped_type *pmVar9;
  char *local_4c8;
  allocator local_3f1;
  key_type local_3f0;
  allocator local_3c9;
  string local_3c8;
  undefined1 local_3a8 [8];
  string prepro;
  char *sep;
  undefined1 local_358 [8];
  string includes;
  key_type local_330;
  undefined4 local_30c;
  string local_308;
  undefined1 local_2e8 [8];
  ostringstream e;
  cmLocalGenerator *lg;
  string local_160;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  string exportDirs;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string dirs;
  undefined1 local_a0 [8];
  cmGeneratorExpression ge;
  allocator local_69;
  string local_68;
  char *local_48;
  char *input;
  char *propName;
  cmGeneratorTarget *target;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  ImportPropertyMap *properties_local;
  cmTargetExport *pcStack_18;
  PreprocessContext preprocessRule_local;
  cmTargetExport *tei_local;
  cmExportFileGenerator *this_local;
  
  this_01 = tei->Target;
  propName = (char *)this_01;
  target = (cmGeneratorTarget *)missingTargets;
  missingTargets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)properties;
  properties_local._4_4_ = preprocessRule;
  pcStack_18 = tei;
  tei_local = (cmTargetExport *)this;
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x16f,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  input = "INTERFACE_INCLUDE_DIRECTORIES";
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"INTERFACE_INCLUDE_DIRECTORIES",&local_69);
  pcVar3 = cmGeneratorTarget::GetProperty(this_01,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  this_00 = (cmListFileBacktrace *)((long)&dirs.field_2 + 8);
  local_48 = pcVar3;
  cmListFileBacktrace::cmListFileBacktrace(this_00);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_a0,this_00);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)((long)&dirs.field_2 + 8));
  cmGeneratorExpression::Preprocess
            ((string *)&cge,&pcStack_18->InterfaceIncludeDirectories,properties_local._4_4_,true);
  (*this->_vptr_cmExportFileGenerator[0x11])(this,&cge);
  cmGeneratorExpression::Parse
            ((cmGeneratorExpression *)((long)&exportDirs.field_2 + 8),(string *)local_a0);
  r = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref
                ((auto_ptr *)(exportDirs.field_2._M_local_buf + 8));
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff18,r);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(exportDirs.field_2._M_local_buf + 8));
  pcVar4 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff18);
  pcVar5 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)propName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"",&local_139);
  pcVar3 = propName;
  std::__cxx11::string::string((string *)&local_160);
  pcVar3 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar4,pcVar5,&local_138,false,(cmGeneratorTarget *)pcVar3,
                      (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_118,pcVar3,(allocator *)((long)&lg + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&lg + 7));
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  pcVar4 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff18);
  bVar2 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar4);
  if (bVar2) {
    pcVar5 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)propName);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
    poVar6 = std::operator<<((ostream *)local_2e8,"Target \"");
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)propName);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,
                    "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                   );
    std::__cxx11::ostringstream::str();
    cmLocalGenerator::IssueMessage(pcVar5,FATAL_ERROR,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    local_30c = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
    goto LAB_00773a76;
  }
  if ((local_48 == (char *)0x0) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0)) {
    local_30c = 1;
    goto LAB_00773a76;
  }
  if (((local_48 != (char *)0x0) && (*local_48 == '\0')) &&
     (uVar8 = std::__cxx11::string::empty(), pvVar1 = missingTargets_local, pcVar3 = input,
     (uVar8 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_330,pcVar3,(allocator *)(includes.field_2._M_local_buf + 0xf));
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pvVar1,&local_330);
    std::__cxx11::string::operator=((string *)pmVar9,"");
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator((allocator<char> *)(includes.field_2._M_local_buf + 0xf));
    local_30c = 1;
    goto LAB_00773a76;
  }
  prefixItems((string *)local_118);
  if (local_48 == (char *)0x0) {
    local_4c8 = "";
  }
  else {
    local_4c8 = local_48;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_358,local_4c8,(allocator *)((long)&sep + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 7));
  pcVar3 = "";
  if (local_48 != (char *)0x0) {
    pcVar3 = ";";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prepro.field_2 + 8),pcVar3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
  std::__cxx11::string::operator+=((string *)local_358,(string *)(prepro.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(prepro.field_2._M_local_buf + 8));
  cmGeneratorExpression::Preprocess
            ((string *)local_3a8,(string *)local_358,properties_local._4_4_,true);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    ResolveTargetsInGeneratorExpressions
              (this,(string *)local_3a8,(cmGeneratorTarget *)propName,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)target,NoReplaceFreeTargets);
    target_00 = propName;
    pcVar3 = input;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,pcVar3,&local_3c9);
    bVar2 = checkInterfaceDirs((string *)local_3a8,(cmGeneratorTarget *)target_00,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    pvVar1 = missingTargets_local;
    pcVar3 = input;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f0,pcVar3,&local_3f1);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)pvVar1,&local_3f0);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)local_3a8);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      goto LAB_00773a54;
    }
    local_30c = 1;
  }
  else {
LAB_00773a54:
    local_30c = 0;
  }
  std::__cxx11::string::~string((string *)local_3a8);
  std::__cxx11::string::~string((string *)local_358);
LAB_00773a76:
  std::__cxx11::string::~string((string *)local_118);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string((string *)&cge);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_a0);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmTargetExport* tei, cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget* target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  const char* input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
    tei->InterfaceIncludeDirectories, preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", false, target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && !*input) && exportDirs.empty()) {
    // Set to empty
    properties[propName] = "";
    return;
  }

  prefixItems(exportDirs);

  std::string includes = (input ? input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target, missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}